

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_AmrLevel.cpp
# Opt level: O3

void __thiscall
amrex::FillPatchIteratorHelper::FillPatchIteratorHelper
          (FillPatchIteratorHelper *this,AmrLevel *amrlevel,MultiFab *leveldata)

{
  _Rb_tree_header *p_Var1;
  allocator_type local_11;
  
  this->m_amrlevel = amrlevel;
  this->m_leveldata = leveldata;
  MultiFabCopyDescriptor::MultiFabCopyDescriptor(&this->m_mfcd);
  std::
  vector<amrex::Vector<amrex::FabArrayId,_std::allocator<amrex::FabArrayId>_>,_std::allocator<amrex::Vector<amrex::FabArrayId,_std::allocator<amrex::FabArrayId>_>_>_>
  ::vector(&(this->m_mfid).
            super_vector<amrex::Vector<amrex::FabArrayId,_std::allocator<amrex::FabArrayId>_>,_std::allocator<amrex::Vector<amrex::FabArrayId,_std::allocator<amrex::FabArrayId>_>_>_>
           ,(long)this->m_amrlevel->level + 1,&local_11);
  p_Var1 = &(this->m_ba)._M_t._M_impl.super__Rb_tree_header;
  (this->m_ba)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_ba)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_ba)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_ba)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_ba)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->m_fbox)._M_t._M_impl.super__Rb_tree_header;
  (this->m_fbox)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_fbox)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_fbox)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_fbox)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_fbox)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->m_cbox)._M_t._M_impl.super__Rb_tree_header;
  (this->m_cbox)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_cbox)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_cbox)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_cbox)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_cbox)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->m_fbid)._M_t._M_impl.super__Rb_tree_header;
  (this->m_fbid)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_fbid)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_fbid)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_fbid)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_fbid)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  return;
}

Assistant:

FillPatchIteratorHelper::FillPatchIteratorHelper (AmrLevel& amrlevel,
                                                  MultiFab& leveldata)
    :
    m_amrlevel(amrlevel),
    m_leveldata(leveldata),
    m_mfid(m_amrlevel.level+1)
{}